

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O2

ggml_threadpool *
ggml_threadpool_new_impl(ggml_threadpool_params *tpp,ggml_cgraph *cgraph,ggml_cplan *cplan)

{
  _Bool _Var1;
  int iVar2;
  pthread_mutex_t *__mutex;
  void *__s;
  undefined4 *puVar3;
  long lVar4;
  _Bool *p_Var5;
  int32_t cpumask_iter;
  void *local_38;
  
  __mutex = (pthread_mutex_t *)ggml_aligned_malloc(0x140);
  *(ggml_cgraph **)((long)__mutex + 0x58) = cgraph;
  *(ggml_cplan **)((long)__mutex + 0x60) = cplan;
  lVar4 = 0;
  LOCK();
  *(undefined4 *)((long)__mutex + 0x68) = 0;
  UNLOCK();
  LOCK();
  *(undefined4 *)((long)__mutex + 0x80) = 0;
  UNLOCK();
  LOCK();
  *(undefined4 *)((long)__mutex + 0xc0) = 0;
  UNLOCK();
  LOCK();
  *(undefined4 *)((long)__mutex + 0x100) = 0;
  UNLOCK();
  LOCK();
  *(undefined1 *)((long)__mutex + 0x104) = 0;
  UNLOCK();
  LOCK();
  *(_Bool *)((long)__mutex + 0x105) = tpp->paused;
  UNLOCK();
  LOCK();
  *(undefined4 *)((long)__mutex + 0x108) = 0xffffffff;
  UNLOCK();
  *(undefined8 *)((long)__mutex + 0x110) = 0;
  iVar2 = tpp->n_threads;
  __mutex[7].__data.__lock = iVar2;
  LOCK();
  *(int *)((long)__mutex + 0x11c) = iVar2;
  UNLOCK();
  *(undefined8 *)((long)__mutex + 0x120) = *(undefined8 *)&tpp->prio;
  *(undefined4 *)((long)__mutex + 0x128) = 0;
  __s = (void *)ggml_aligned_malloc((long)iVar2 * 0x220);
  memset(__s,0,(long)iVar2 * 0x220);
  iVar2 = tpp->n_threads;
  puVar3 = (undefined4 *)((long)__s + 0x218);
  for (; lVar4 < iVar2; lVar4 = lVar4 + 1) {
    *(pthread_mutex_t **)(puVar3 + -2) = __mutex;
    *puVar3 = (int)lVar4;
    puVar3 = puVar3 + 0x88;
  }
  lVar4 = 0;
  *(void **)((long)__mutex + 0x110) = __s;
  local_38 = __s;
  pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)(__mutex + 1),(pthread_condattr_t *)0x0);
  cpumask_iter = 0;
  p_Var5 = (_Bool *)((long)__s + 0x228);
  do {
    lVar4 = lVar4 + 1;
    if (tpp->n_threads <= lVar4) {
      ggml_thread_cpumask_next
                (tpp->cpumask,(_Bool *)((long)local_38 + 8),tpp->strict_cpu,&cpumask_iter);
      if ((*(byte *)((long)__mutex + 0x105) & 1) == 0) {
        ggml_thread_apply_priority(*(int32_t *)((long)__mutex + 0x120));
        p_Var5 = (_Bool *)(*(long *)((long)__mutex + 0x110) + 8);
        _Var1 = ggml_thread_cpumask_is_valid(p_Var5);
        if (_Var1) {
          ggml_thread_apply_affinity(p_Var5);
        }
      }
      return (ggml_threadpool *)__mutex;
    }
    ggml_thread_cpumask_next(tpp->cpumask,p_Var5,tpp->strict_cpu,&cpumask_iter);
    iVar2 = pthread_create((pthread_t *)(p_Var5 + -8),(pthread_attr_t *)0x0,
                           ggml_graph_compute_secondary_thread,p_Var5 + -8);
    p_Var5 = p_Var5 + 0x220;
  } while (iVar2 == 0);
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
             ,0xbfe,"GGML_ASSERT(%s) failed","rc == 0");
}

Assistant:

static struct ggml_threadpool * ggml_threadpool_new_impl(
    struct ggml_threadpool_params * tpp,
               struct ggml_cgraph * cgraph,
                struct ggml_cplan * cplan) {

    struct ggml_threadpool * threadpool =
        ggml_aligned_malloc(sizeof(struct ggml_threadpool));
    {
        threadpool->cgraph           = cgraph;
        threadpool->cplan            = cplan;
        threadpool->n_graph          = 0;
        threadpool->n_barrier        = 0;
        threadpool->n_barrier_passed = 0;
        threadpool->current_chunk    = 0;
        threadpool->stop             = false;
        threadpool->pause            = tpp->paused;
        threadpool->abort            = -1;
        threadpool->workers          = NULL;
        threadpool->n_threads_max    = tpp->n_threads;
        threadpool->n_threads_cur    = tpp->n_threads;
        threadpool->poll             = tpp->poll;
        threadpool->prio             = tpp->prio;
        threadpool->ec               = GGML_STATUS_SUCCESS;
    }

    // Allocate and init workers state
    const size_t workers_size = sizeof(struct ggml_compute_state) * tpp->n_threads;
    struct ggml_compute_state * workers = ggml_aligned_malloc(workers_size);

    memset(workers, 0, workers_size);
    for (int j = 0; j < tpp->n_threads; j++) {
        workers[j].threadpool = threadpool;
        workers[j].ith        = j;
    }

    threadpool->workers = workers;

#ifndef GGML_USE_OPENMP
    ggml_mutex_init(&threadpool->mutex);
    ggml_cond_init(&threadpool->cond);

    // Spin the threads for all workers, and update CPU placements.
    // Place the main thread last (towards the higher numbered CPU cores).

    int32_t cpumask_iter = 0;

    for (int j = 1; j < tpp->n_threads; j++) {
        ggml_thread_cpumask_next(tpp->cpumask, workers[j].cpumask, tpp->strict_cpu, &cpumask_iter);

        int32_t rc = ggml_thread_create(&workers[j].thrd, NULL, ggml_graph_compute_secondary_thread, &workers[j]);
        GGML_ASSERT(rc == 0);
    }

    ggml_thread_cpumask_next(tpp->cpumask, workers[0].cpumask, tpp->strict_cpu, &cpumask_iter);

    if (!threadpool->pause) {
        // Update main thread prio and affinity at the start, otherwise we'll do it in resume
        ggml_thread_apply_priority(threadpool->prio);
        if (ggml_thread_cpumask_is_valid(threadpool->workers[0].cpumask)) {
            ggml_thread_apply_affinity(threadpool->workers[0].cpumask);
        }
    }
#endif // GGML_USE_OPENMP

    return threadpool;
}